

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genkat.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  char *local_30;
  uint32_t local_28;
  argon2_type local_24;
  uint32_t version;
  argon2_type type;
  char *type_str;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    local_30 = "i";
  }
  else {
    local_30 = argv[1];
  }
  local_24 = Argon2_i;
  local_28 = 0x13;
  iVar1 = strcmp(local_30,"d");
  if (iVar1 == 0) {
    local_24 = Argon2_d;
  }
  else {
    iVar1 = strcmp(local_30,"i");
    if (iVar1 == 0) {
      local_24 = Argon2_i;
    }
    else {
      iVar1 = strcmp(local_30,"id");
      if (iVar1 == 0) {
        local_24 = Argon2_id;
      }
      else {
        fatal("wrong Argon2 type");
      }
    }
  }
  if (2 < argc) {
    uVar2 = strtoul(argv[2],(char **)0x0,10);
    local_28 = (uint32_t)uVar2;
  }
  if ((local_28 != 0x10) && (local_28 != 0x13)) {
    fatal("wrong Argon2 version number");
  }
  generate_testvectors(local_24,local_28);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    /* Get and check Argon2 type */
    const char *type_str = (argc > 1) ? argv[1] : "i";
    argon2_type type = Argon2_i;
    uint32_t version = ARGON2_VERSION_NUMBER;
    if (!strcmp(type_str, "d")) {
        type = Argon2_d;
    } else if (!strcmp(type_str, "i")) {
        type = Argon2_i;
    } else if (!strcmp(type_str, "id")) {
        type = Argon2_id;
    } else {
        fatal("wrong Argon2 type");
    }

    /* Get and check Argon2 version number */
    if(argc > 2) {
        version = strtoul(argv[2], NULL, 10);
    }
    if (ARGON2_VERSION_10 != version && ARGON2_VERSION_NUMBER != version) {
        fatal("wrong Argon2 version number");
    }

    generate_testvectors(type, version);
    return ARGON2_OK;
}